

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

Uint32 anon_unknown.dwarf_358555::RenderTargetImpl::factorToGlConstant(Factor blendFactor)

{
  ostream *poVar1;
  
  if (blendFactor < (DstAlpha|SrcColor)) {
    return *(Uint32 *)(&DAT_00224374 + (ulong)blendFactor * 4);
  }
  poVar1 = sf::err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero.",0x49
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

sf::Uint32 factorToGlConstant(sf::BlendMode::Factor blendFactor)
        {
            switch (blendFactor)
            {
                case sf::BlendMode::Zero:             return GL_ZERO;
                case sf::BlendMode::One:              return GL_ONE;
                case sf::BlendMode::SrcColor:         return GL_SRC_COLOR;
                case sf::BlendMode::OneMinusSrcColor: return GL_ONE_MINUS_SRC_COLOR;
                case sf::BlendMode::DstColor:         return GL_DST_COLOR;
                case sf::BlendMode::OneMinusDstColor: return GL_ONE_MINUS_DST_COLOR;
                case sf::BlendMode::SrcAlpha:         return GL_SRC_ALPHA;
                case sf::BlendMode::OneMinusSrcAlpha: return GL_ONE_MINUS_SRC_ALPHA;
                case sf::BlendMode::DstAlpha:         return GL_DST_ALPHA;
                case sf::BlendMode::OneMinusDstAlpha: return GL_ONE_MINUS_DST_ALPHA;
            }

            sf::err() << "Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero." << std::endl;
            assert(false);
            return GL_ZERO;
        }